

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O1

void __thiscall
DatabaseSnapshot::read_iterator
          (DatabaseSnapshot *this,Task *task,string *iterator_id,int count,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,uint64_t *out_iterator_position,uint64_t *out_iterator_files)

{
  bool bVar1;
  uint64_t uVar2;
  char cVar3;
  const_iterator cVar4;
  long *plVar5;
  runtime_error *this_00;
  _Base_ptr p_Var6;
  size_type *psVar7;
  char cVar8;
  string file_offset;
  string byte_offset;
  string param;
  OnDiskIterator iterator_copy;
  long *local_260 [2];
  long local_250 [2];
  long *local_240;
  uint local_238;
  long local_230 [2];
  long *local_220;
  uint local_218;
  undefined4 uStack_214;
  long local_210 [2];
  string local_200;
  Task *local_1e0;
  DBChange local_1d8;
  OnDiskIterator local_190;
  
  *out_iterator_files = 0;
  *out_iterator_position = 0;
  local_1e0 = task;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          ::find(&(this->iterators)._M_t,iterator_id);
  if ((_Rb_tree_header *)cVar4._M_node == &(this->iterators)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"tried to read non-existent iterator");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  DatabaseName::DatabaseName(&local_190.name,(DatabaseName *)(cVar4._M_node + 2));
  DatabaseName::DatabaseName(&local_190.datafile_name,(DatabaseName *)(cVar4._M_node + 7));
  local_190.total_files = *(uint64_t *)(cVar4._M_node + 0xc);
  local_190.byte_offset = (uint64_t)cVar4._M_node[0xc]._M_parent;
  local_190.file_offset = (uint64_t)cVar4._M_node[0xc]._M_left;
  local_190.last_read_time = (time_t)cVar4._M_node[0xc]._M_right;
  OnDiskIterator::pop(&local_190,count,out);
  uVar2 = local_190.byte_offset;
  *out_iterator_files = local_190.total_files;
  *out_iterator_position = local_190.file_offset;
  cVar8 = '\x01';
  if ((_Base_ptr)0x9 < local_190.byte_offset) {
    p_Var6 = (_Base_ptr)local_190.byte_offset;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (p_Var6 < (_Base_ptr)0x64) {
        cVar8 = cVar8 + -2;
        goto LAB_0012f2a0;
      }
      if (p_Var6 < (_Base_ptr)0x3e8) {
        cVar8 = cVar8 + -1;
        goto LAB_0012f2a0;
      }
      if (p_Var6 < (_Base_ptr)0x2710) goto LAB_0012f2a0;
      bVar1 = (_Base_ptr)0x1869f < p_Var6;
      p_Var6 = (_Base_ptr)((ulong)p_Var6 / 10000);
      cVar3 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0012f2a0:
  local_220 = local_210;
  std::__cxx11::string::_M_construct((ulong)&local_220,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_220,local_218,uVar2);
  uVar2 = local_190.file_offset;
  cVar8 = '\x01';
  if ((_Base_ptr)0x9 < local_190.file_offset) {
    p_Var6 = (_Base_ptr)local_190.file_offset;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (p_Var6 < (_Base_ptr)0x64) {
        cVar8 = cVar8 + -2;
        goto LAB_0012f32a;
      }
      if (p_Var6 < (_Base_ptr)0x3e8) {
        cVar8 = cVar8 + -1;
        goto LAB_0012f32a;
      }
      if (p_Var6 < (_Base_ptr)0x2710) goto LAB_0012f32a;
      bVar1 = (_Base_ptr)0x1869f < p_Var6;
      p_Var6 = (_Base_ptr)((ulong)p_Var6 / 10000);
      cVar3 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0012f32a:
  local_240 = local_230;
  std::__cxx11::string::_M_construct((ulong)&local_240,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_240,local_238,uVar2);
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,local_220,(long)local_220 + CONCAT44(uStack_214,local_218));
  std::__cxx11::string::append((char *)local_260);
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_260,(ulong)local_240);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_200.field_2._M_allocated_capacity = *psVar7;
    local_200.field_2._8_8_ = plVar5[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar7;
    local_200._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_200._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  local_260[0] = (long *)CONCAT44(local_260[0]._4_4_,6);
  DBChange::DBChange(&local_1d8,(DbChangeType *)local_260,&local_190.name.filename,&local_200);
  std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
            ((vector<DBChange,_std::allocator<DBChange>_> *)(local_1e0 + 8),&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.parameter._M_dataplus._M_p != &local_1d8.parameter.field_2) {
    operator_delete(local_1d8.parameter._M_dataplus._M_p,
                    local_1d8.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.obj_name._M_dataplus._M_p != &local_1d8.obj_name.field_2) {
    operator_delete(local_1d8.obj_name._M_dataplus._M_p,
                    local_1d8.obj_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  OnDiskIterator::~OnDiskIterator(&local_190);
  return;
}

Assistant:

void DatabaseSnapshot::read_iterator(Task *task, const std::string &iterator_id,
                                     int count, std::vector<std::string> *out,
                                     uint64_t *out_iterator_position,
                                     uint64_t *out_iterator_files) const {
    *out_iterator_files = 0;
    *out_iterator_position = 0;

    auto it = iterators.find(iterator_id);
    if (it == iterators.end()) {
        throw std::runtime_error("tried to read non-existent iterator");
    }

    OnDiskIterator iterator_copy = it->second;
    iterator_copy.pop(count, out);
    *out_iterator_files = iterator_copy.get_total_files();
    *out_iterator_position = iterator_copy.get_file_offset();

    std::string byte_offset = std::to_string(iterator_copy.get_byte_offset());
    std::string file_offset = std::to_string(iterator_copy.get_file_offset());
    std::string param = byte_offset + ":" + file_offset;
    task->change(DBChange(DbChangeType::UpdateIterator,
                          iterator_copy.get_name().get_filename(), param));
}